

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O3

void __thiscall Spectrum_SamplingPdfY_Test::TestBody(Spectrum_SamplingPdfY_Test *this)

{
  undefined1 auVar1 [16];
  int *piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  char *message;
  undefined1 *puVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  undefined8 in_XMM2_Qb;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  float local_50;
  float local_4c;
  AssertHelper local_48;
  float local_3c;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 extraout_var [60];
  
  iVar7 = 0;
  puVar8 = &DAT_5851f42d4c957f2e;
  local_50 = 0.0;
  do {
    uVar4 = (uint)((ulong)puVar8 >> 0x2d) ^ (uint)((ulong)puVar8 >> 0x1b);
    bVar6 = (byte)((ulong)puVar8 >> 0x3b);
    auVar9._4_4_ = in_XMM2_Db;
    auVar9._0_4_ = in_XMM2_Da;
    auVar9._8_8_ = in_XMM2_Qb;
    auVar9 = vcvtusi2ss_avx512f(auVar9,uVar4 >> bVar6 | uVar4 << 0x20 - bVar6);
    auVar9 = vminss_avx(ZEXT416((uint)(auVar9._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar11._0_4_ = (auVar9._0_4_ + (float)iVar7) / 1000.0;
    auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar9 = vfmadd132ss_fma(auVar11,SUB6416(ZEXT464(0x3f5b5e7f),0),ZEXT416(0xbfe9eb96));
    auVar13._0_4_ = atanhf(auVar9._0_4_);
    auVar13._4_60_ = extraout_var;
    auVar9 = vfmadd132ss_fma(auVar13._0_16_,SUB6416(ZEXT464(0x44068000),0),ZEXT416(0xc30ae38e));
    fVar10 = auVar9._0_4_;
    if ((360.0 <= fVar10) && (fVar10 <= 830.0)) {
      local_4c = fVar10;
      fVar10 = coshf((fVar10 + -538.0) * 0.0072);
      piVar2 = pbrt::Spectra::y;
      fVar10 = 0.003939804 / (fVar10 * fVar10);
      if (0.0 < fVar10) {
        local_3c = fVar10;
        lVar5 = lroundf(local_4c);
        uVar4 = (int)lVar5 - *piVar2;
        fVar10 = 0.0;
        if ((-1 < (int)uVar4) && ((ulong)uVar4 < *(ulong *)(piVar2 + 8))) {
          fVar10 = *(float *)(*(long *)(piVar2 + 4) + (ulong)uVar4 * 4);
        }
        local_50 = local_50 + fVar10 / local_3c;
      }
    }
    iVar7 = iVar7 + 1;
    puVar8 = (undefined1 *)((long)puVar8 * 0x5851f42d4c957f2d + 1);
  } while (iVar7 != 1000);
  local_4c = local_50 / 1000.0;
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f50624dd2f1a9fc;
  auVar12._0_4_ = (local_4c + -106.856895) / 106.856895;
  auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar12,auVar1);
  local_48.data_._0_4_ = auVar9._0_4_;
  testing::internal::CmpHelperLT<float,double>
            (local_38,"std::abs((yint - CIE_Y_integral) / CIE_Y_integral)","1e-3",(float *)&local_48
             ,(double *)&local_58);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    std::ostream::_M_insert<double>((double)local_4c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_58.ptr_ + 0x10)," vs. ",5);
    std::ostream::_M_insert<double>(106.85689544677734);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
               ,0x87,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Spectrum, SamplingPdfY) {
    // Make sure we can integrate the y matching curve correctly
    Float ysum = 0;
    int n = 1000;
    for (Float u : Stratified1D(n)) {
        Float lambda = SampleXYZMatching(u);
        Float pdf = XYZMatchingPDF(lambda);
        if (pdf > 0)
            ysum += Spectra::Y()(lambda) / pdf;
    }
    Float yint = ysum / n;

    EXPECT_LT(std::abs((yint - CIE_Y_integral) / CIE_Y_integral), 1e-3)
        << yint << " vs. " << CIE_Y_integral;
}